

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_contains_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  uint8_t uVar1;
  uint uVar2;
  uint16_t *puVar3;
  uint uVar4;
  _Bool _Var5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  uVar4 = val >> 0x10;
  iVar8 = -1;
  if (context->container != (void *)0x0) {
    if (uVar4 == context->key) goto LAB_001037b6;
    if ((context->container != (void *)0x0) && (context->key < uVar4)) {
      iVar8 = context->idx;
    }
  }
  puVar3 = (r->high_low_container).keys;
  uVar2 = (r->high_low_container).size;
  uVar10 = iVar8 + 1;
  uVar7 = uVar10;
  if (((int)uVar10 < (int)uVar2) && (uVar6 = (ushort)(val >> 0x10), puVar3[(int)uVar10] < uVar6)) {
    uVar9 = iVar8 + 2;
    iVar8 = 1;
    if ((int)uVar9 < (int)uVar2) {
      iVar11 = 1;
      do {
        iVar8 = iVar11;
        if (uVar6 <= puVar3[(int)uVar9]) goto LAB_00103775;
        iVar8 = iVar11 * 2;
        uVar9 = uVar10 + iVar11 * 2;
        iVar11 = iVar8;
      } while ((int)uVar9 < (int)uVar2);
    }
    uVar9 = uVar2 - 1;
LAB_00103775:
    uVar7 = uVar9;
    if (((puVar3[(int)uVar9] != uVar6) && (uVar7 = uVar2, uVar6 <= puVar3[(int)uVar9])) &&
       (uVar7 = uVar9, (iVar8 >> 1) + uVar10 + 1 != uVar9)) {
      uVar10 = (iVar8 >> 1) + uVar10;
      do {
        uVar7 = (int)(uVar10 + uVar9) >> 1;
        if (puVar3[(int)uVar7] == uVar6) break;
        if (puVar3[(int)uVar7] < uVar6) {
          uVar10 = uVar7;
          uVar7 = uVar9;
        }
        uVar9 = uVar7;
        uVar7 = uVar9;
      } while (uVar10 + 1 != uVar9);
    }
  }
  if (uVar7 != uVar2) {
    uVar10 = uVar7 & 0xffff;
    uVar1 = (r->high_low_container).typecodes[uVar10];
    context->container = (r->high_low_container).containers[uVar10];
    context->typecode = uVar1;
    context->idx = uVar7;
    uVar6 = puVar3[uVar10];
    context->key = uVar6;
    if (uVar4 == uVar6) {
LAB_001037b6:
      _Var5 = container_contains(context->container,(uint16_t)val,context->typecode);
      return _Var5;
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_bulk(const roaring_bitmap_t *r,
                                  roaring_bulk_context_t *context,
                                  uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        int32_t start_idx = -1;
        if (context->container != NULL && context->key < key) {
            start_idx = context->idx;
        }
        int idx = ra_advance_until(&r->high_low_container, key, start_idx);
        if (idx == ra_get_size(&r->high_low_container)) {
            return false;
        }
        uint8_t typecode;
        context->container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)idx, &typecode);
        context->typecode = typecode;
        context->idx = idx;
        context->key =
            ra_get_key_at_index(&r->high_low_container, (uint16_t)idx);
        // ra_advance_until finds the next key >= the target, we found a later
        // container.
        if (context->key != key) {
            return false;
        }
    }
    // context is now set up
    return container_contains(context->container, val & 0xFFFF,
                              context->typecode);
}